

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceTree.h
# Opt level: O2

Point<double> * __thiscall
Parfait::DistanceTree::closestPoint
          (Point<double> *__return_storage_ptr__,DistanceTree *this,Point<double> *p)

{
  PriorityQueue process;
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
  local_d8;
  CurrentState local_b8;
  CurrentState local_70;
  
  local_d8.c.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.c.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.c.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.query_point.pos._M_elems[0] = 1.79769313486232e+308;
  local_b8.query_point.pos._M_elems[1] =
       (double)((ulong)local_b8.query_point.pos._M_elems[1] & 0xffffffff00000000);
  std::
  priority_queue<std::pair<double,_int>,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>,_std::greater<void>_>
  ::push(&local_d8,(value_type *)&local_b8);
  local_b8.query_point.pos._M_elems[2] = (p->pos)._M_elems[2];
  local_b8.query_point.pos._M_elems[0] = (p->pos)._M_elems[0];
  local_b8.query_point.pos._M_elems[1] = (p->pos)._M_elems[1];
  local_b8.surface_location.pos._M_elems[2]._0_1_ = 0;
  local_b8.surface_location.pos._M_elems[2]._1_7_ = 0;
  local_b8.surface_location.pos._M_elems[0] = 0.0;
  local_b8.surface_location.pos._M_elems[1] = 0.0;
  local_b8.actual_distance._0_1_ = 0xff;
  local_b8.actual_distance._1_7_ = 0x7fefffffffffff;
  local_b8.found_on_surface = false;
  do {
    if (local_d8.c.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        local_d8.c.
        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish) break;
    closestPoint(&local_70,this,p,&local_b8,&local_d8);
    local_b8.surface_location.pos._M_elems[0] = local_70.surface_location.pos._M_elems[0];
    local_b8.surface_location.pos._M_elems[1] = local_70.surface_location.pos._M_elems[1];
    local_b8.actual_distance._0_1_ = local_70.actual_distance._0_1_;
    local_b8.actual_distance._1_7_ = local_70.actual_distance._1_7_;
    local_b8.found_on_surface = local_70.found_on_surface;
    local_b8.surface_location.pos._M_elems[2]._0_1_ =
         local_70.surface_location.pos._M_elems[2]._0_1_;
    local_b8.surface_location.pos._M_elems[2]._1_7_ =
         local_70.surface_location.pos._M_elems[2]._1_7_;
    local_b8.query_point.pos._M_elems[2] = local_70.query_point.pos._M_elems[2];
    local_b8.query_point.pos._M_elems[0] = local_70.query_point.pos._M_elems[0];
    local_b8.query_point.pos._M_elems[1] = local_70.query_point.pos._M_elems[1];
  } while ((local_d8.c.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start)->first <
           (double)CONCAT71(local_b8.actual_distance._1_7_,local_70.actual_distance._0_1_) ||
           (local_d8.c.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start)->first ==
           (double)CONCAT71(local_b8.actual_distance._1_7_,local_70.actual_distance._0_1_));
  (__return_storage_ptr__->pos)._M_elems[2] =
       (double)CONCAT71(local_b8.surface_location.pos._M_elems[2]._1_7_,
                        local_b8.surface_location.pos._M_elems[2]._0_1_);
  (__return_storage_ptr__->pos)._M_elems[0] = local_b8.surface_location.pos._M_elems[0];
  (__return_storage_ptr__->pos)._M_elems[1] = local_b8.surface_location.pos._M_elems[1];
  std::_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~_Vector_base
            ((_Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
             &local_d8);
  return __return_storage_ptr__;
}

Assistant:

inline Parfait::Point<double> closestPoint(const Parfait::Point<double>& p) const {
          PriorityQueue process;
          process.push(std::make_pair(std::numeric_limits<double>::max(), 0));

          CurrentState current_state(p);

          while(not process.empty()) {
              current_state = closestPoint(p, current_state, process);
              if(current_state.actualDistance() < process.top().first) {
                  break;
              }
          }
          return current_state.surfaceLocation();
      }